

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jsoncpp.cpp
# Opt level: O3

string * __thiscall
Json::valueToQuotedStringN_abi_cxx11_
          (string *__return_storage_ptr__,Json *this,char *value,uint length)

{
  pointer pcVar1;
  undefined8 uVar2;
  ulong uVar3;
  long *plVar4;
  string *extraout_RAX;
  string *psVar5;
  string *extraout_RAX_00;
  string *extraout_RAX_01;
  undefined4 in_register_0000000c;
  char *pcVar6;
  long *plVar7;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar8;
  Json *pJVar9;
  long lVar10;
  Json JVar11;
  ulong uVar12;
  ostringstream oss;
  undefined1 auStack_1d8 [8];
  undefined1 *local_1d0 [2];
  undefined1 local_1c0 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_1b0;
  long *local_1a8;
  long local_1a0;
  long local_198;
  long alStack_190 [11];
  ios_base local_138 [112];
  char acStack_c8 [152];
  
  pcVar6 = (char *)CONCAT44(in_register_0000000c,length);
  if (this == (Json *)0x0) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"","",pcVar6);
    return extraout_RAX;
  }
  if ((int)value != 0) {
    uVar12 = (ulong)value & 0xffffffff;
    pcVar6 = "\"\\\b\f\n\r\t";
    pJVar9 = this;
    do {
      JVar11 = (Json)0x22;
      lVar10 = 1;
      do {
        if (JVar11 == *pJVar9) goto LAB_0010f361;
        JVar11 = *(Json *)("\"\\\b\f\n\r\t" + lVar10);
        lVar10 = lVar10 + 1;
      } while (lVar10 != 8);
      pJVar9 = pJVar9 + 1;
    } while (pJVar9 < this + uVar12);
    uVar3 = 0;
    do {
      if ((byte)this[uVar3] < 0x20) goto LAB_0010f361;
      uVar3 = uVar3 + 1;
    } while (uVar12 != uVar3);
  }
  local_1d0[0] = local_1c0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1d0,"\"","",pcVar6);
  plVar4 = (long *)std::__cxx11::string::append((char *)local_1d0);
  plVar7 = plVar4 + 2;
  if ((long *)*plVar4 == plVar7) {
    local_198 = *plVar7;
    alStack_190[0] = plVar4[3];
    local_1a8 = &local_198;
  }
  else {
    local_198 = *plVar7;
    local_1a8 = (long *)*plVar4;
  }
  local_1a0 = plVar4[1];
  *plVar4 = (long)plVar7;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  psVar5 = (string *)std::__cxx11::string::append((char *)&local_1a8);
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  pcVar1 = (psVar5->_M_dataplus)._M_p;
  paVar8 = &psVar5->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 == paVar8) {
    uVar2 = *(undefined8 *)((long)&psVar5->field_2 + 8);
    (__return_storage_ptr__->field_2)._M_allocated_capacity = paVar8->_M_allocated_capacity;
    *(undefined8 *)((long)&__return_storage_ptr__->field_2 + 8) = uVar2;
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = pcVar1;
    (__return_storage_ptr__->field_2)._M_allocated_capacity = paVar8->_M_allocated_capacity;
  }
  __return_storage_ptr__->_M_string_length = psVar5->_M_string_length;
  (psVar5->_M_dataplus)._M_p = (pointer)paVar8;
  psVar5->_M_string_length = 0;
  (psVar5->field_2)._M_local_buf[0] = '\0';
  if (local_1a8 != &local_198) {
    operator_delete(local_1a8);
    psVar5 = extraout_RAX_00;
  }
  if (local_1d0[0] == local_1c0) {
    return psVar5;
  }
  operator_delete(local_1d0[0]);
  return extraout_RAX_01;
LAB_0010f361:
  local_1b0 = &__return_storage_ptr__->field_2;
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)local_1b0;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  std::__cxx11::string::reserve((ulong)__return_storage_ptr__);
  std::__cxx11::string::append((char *)__return_storage_ptr__);
  uVar3 = 0;
  do {
    JVar11 = this[uVar3];
    switch(JVar11) {
    case (Json)0x8:
      break;
    case (Json)0x9:
      break;
    case (Json)0xa:
      break;
    case (Json)0xb:
switchD_0010f3b8_caseD_b:
      if ((byte)JVar11 < 0x20) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a8);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,"\\u",2);
        *(uint *)((long)alStack_190 + local_1a8[-3]) =
             *(uint *)((long)alStack_190 + local_1a8[-3]) & 0xffffffb5 | 8;
        *(uint *)((long)alStack_190 + local_1a8[-3]) =
             *(uint *)((long)alStack_190 + local_1a8[-3]) | 0x4000;
        lVar10 = local_1a8[-3];
        if (acStack_c8[lVar10 + 1] == '\0') {
          std::ios::widen((char)auStack_1d8 + (char)lVar10 + '0');
          acStack_c8[lVar10 + 1] = '\x01';
        }
        acStack_c8[lVar10] = '0';
        *(undefined8 *)((long)alStack_190 + local_1a8[-3] + -8) = 4;
        std::ostream::operator<<(&local_1a8,(int)(char)this[uVar3]);
        std::__cxx11::stringbuf::str();
        std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_1d0[0]);
        if (local_1d0[0] != local_1c0) {
          operator_delete(local_1d0[0]);
        }
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1a8);
        std::ios_base::~ios_base(local_138);
      }
      else {
        std::__cxx11::string::push_back((char)__return_storage_ptr__);
      }
      goto LAB_0010f503;
    case (Json)0xc:
      break;
    case (Json)0xd:
      break;
    default:
      if ((JVar11 != (Json)0x5c) && (JVar11 != (Json)0x22)) goto switchD_0010f3b8_caseD_b;
    }
    std::__cxx11::string::append((char *)__return_storage_ptr__);
LAB_0010f503:
    uVar3 = uVar3 + 1;
    if (uVar12 == uVar3) {
      psVar5 = (string *)std::__cxx11::string::append((char *)__return_storage_ptr__);
      return psVar5;
    }
  } while( true );
}

Assistant:

static JSONCPP_STRING valueToQuotedStringN(const char* value, unsigned length) {
  if (value == NULL)
    return "";
  // Not sure how to handle unicode...
  if (strnpbrk(value, "\"\\\b\f\n\r\t", length) == NULL &&
      !containsControlCharacter0(value, length))
    return JSONCPP_STRING("\"") + value + "\"";
  // We have to walk value and escape any special characters.
  // Appending to JSONCPP_STRING is not efficient, but this should be rare.
  // (Note: forward slashes are *not* rare, but I am not escaping them.)
  JSONCPP_STRING::size_type maxsize =
      length * 2 + 3; // allescaped+quotes+NULL
  JSONCPP_STRING result;
  result.reserve(maxsize); // to avoid lots of mallocs
  result += "\"";
  char const* end = value + length;
  for (const char* c = value; c != end; ++c) {
    switch (*c) {
    case '\"':
      result += "\\\"";
      break;
    case '\\':
      result += "\\\\";
      break;
    case '\b':
      result += "\\b";
      break;
    case '\f':
      result += "\\f";
      break;
    case '\n':
      result += "\\n";
      break;
    case '\r':
      result += "\\r";
      break;
    case '\t':
      result += "\\t";
      break;
    // case '/':
    // Even though \/ is considered a legal escape in JSON, a bare
    // slash is also legal, so I see no reason to escape it.
    // (I hope I am not misunderstanding something.)
    // blep notes: actually escaping \/ may be useful in javascript to avoid </
    // sequence.
    // Should add a flag to allow this compatibility mode and prevent this
    // sequence from occurring.
    default:
      if ((isControlCharacter(*c)) || (*c == 0)) {
        JSONCPP_OSTRINGSTREAM oss;
        oss << "\\u" << std::hex << std::uppercase << std::setfill('0')
            << std::setw(4) << static_cast<int>(*c);
        result += oss.str();
      } else {
        result += *c;
      }
      break;
    }
  }
  result += "\"";
  return result;
}